

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_input.hpp
# Opt level: O0

variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *
get_input(variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
         int argc,char **argv)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  byte bVar1;
  ostream *poVar2;
  const_iterator pvVar3;
  basic_ostream<char,_std::char_traits<char>_> *this;
  int local_26c;
  size_t local_268;
  size_t sStack_260;
  basic_ifstream<char,_std::char_traits<char>_> local_240 [8];
  ifstream file;
  undefined1 auStack_38 [8];
  string_view path;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," path-to-input");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    path._M_str._4_4_ = 0;
    std::variant<int,std::ifstream>::variant<int,void,void,int,void>
              ((variant<int,std::ifstream> *)__return_storage_ptr__,(int *)((long)&path._M_str + 4))
    ;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_38,argv[1]);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::begin
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_38);
    std::ifstream::ifstream(local_240,pvVar3,8);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Couldn\'t read ");
      local_268 = (size_t)auStack_38;
      sStack_260 = path._M_len;
      __str._M_str = (char *)path._M_len;
      __str._M_len = (size_t)auStack_38;
      this = std::operator<<(poVar2,__str);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      local_26c = 1;
      std::variant<int,std::ifstream>::variant<int,void,void,int,void>
                ((variant<int,std::ifstream> *)__return_storage_ptr__,&local_26c);
    }
    else {
      std::variant<int,std::ifstream>::variant<std::ifstream,void,void,std::ifstream,void>
                ((variant<int,std::ifstream> *)__return_storage_ptr__,local_240);
    }
    std::ifstream::~ifstream(local_240);
  }
  return __return_storage_ptr__;
}

Assistant:

std::variant<int, std::ifstream> get_input(int argc, char* argv[]) {
  if (argc < 2) {
    std::cout << "usage " << argv[0] << " path-to-input" << std::endl;
    return 0;
  }

  std::string_view path = argv[1];

  auto file = std::ifstream{path.begin()};

  if (!file.good()) {
    std::cerr << "Couldn't read " << path << std::endl;
    return 1;
  }

  return file;
}